

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

ostream * __thiscall cppcms::form_context::out(form_context *this)

{
  cppcms_error *this_00;
  allocator local_39;
  string local_38;
  
  if (this->output_ != (ostream *)0x0) {
    return this->output_;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,"Can\'t use form context without assigned output",&local_39);
  cppcms_error::cppcms_error(this_00,&local_38);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

std::ostream &form_context::out() const
{
	if(!output_)
		throw cppcms_error("Can't use form context without assigned output");
	return *output_;
}